

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_database_statement.cpp
# Opt level: O3

void __thiscall
duckdb::CopyDatabaseStatement::CopyDatabaseStatement
          (CopyDatabaseStatement *this,CopyDatabaseStatement *other)

{
  pointer pcVar1;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CopyDatabaseStatement_01981ae8
  ;
  (this->from_database)._M_dataplus._M_p = (pointer)&(this->from_database).field_2;
  pcVar1 = (other->from_database)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->from_database,pcVar1,pcVar1 + (other->from_database)._M_string_length)
  ;
  (this->to_database)._M_dataplus._M_p = (pointer)&(this->to_database).field_2;
  pcVar1 = (other->to_database)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->to_database,pcVar1,pcVar1 + (other->to_database)._M_string_length);
  this->copy_type = other->copy_type;
  return;
}

Assistant:

CopyDatabaseStatement::CopyDatabaseStatement(const CopyDatabaseStatement &other)
    : SQLStatement(other), from_database(other.from_database), to_database(other.to_database),
      copy_type(other.copy_type) {
}